

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-outputs.cc
# Opt level: O3

void basic_datatype_test_integral<short,true>(string *name)

{
  pointer pcVar1;
  int i;
  int iVar2;
  vector<short,_std::allocator<short>_> v;
  short local_5a;
  vector<short,_std::allocator<short>_> local_58;
  string local_40;
  
  local_58.super__Vector_base<short,_std::allocator<short>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_58.super__Vector_base<short,_std::allocator<short>_>._M_impl.super__Vector_impl_data.
  _M_finish = (short *)0x0;
  local_58.super__Vector_base<short,_std::allocator<short>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (short *)0x0;
  iVar2 = 0;
  do {
    local_5a = (short)iVar2;
    if (local_58.super__Vector_base<short,_std::allocator<short>_>._M_impl.super__Vector_impl_data.
        _M_finish ==
        local_58.super__Vector_base<short,_std::allocator<short>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage) {
      std::vector<short,_std::allocator<short>_>::_M_realloc_insert<short>
                (&local_58,
                 (iterator)
                 local_58.super__Vector_base<short,_std::allocator<short>_>._M_impl.
                 super__Vector_impl_data._M_finish,&local_5a);
    }
    else {
      *local_58.super__Vector_base<short,_std::allocator<short>_>._M_impl.super__Vector_impl_data.
       _M_finish = local_5a;
      local_58.super__Vector_base<short,_std::allocator<short>_>._M_impl.super__Vector_impl_data.
      _M_finish = local_58.super__Vector_base<short,_std::allocator<short>_>._M_impl.
                  super__Vector_impl_data._M_finish + 1;
    }
    iVar2 = iVar2 + 1;
  } while (iVar2 != 4);
  pcVar1 = (name->_M_dataplus)._M_p;
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_40,pcVar1,pcVar1 + name->_M_string_length);
  runtest_maybe_dobin<std::vector<short,std::allocator<short>>,true>(&local_40,&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  if (local_58.super__Vector_base<short,_std::allocator<short>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_58.super__Vector_base<short,_std::allocator<short>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_58.super__Vector_base<short,_std::allocator<short>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_58.super__Vector_base<short,_std::allocator<short>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void basic_datatype_test_integral(std::string name) {
    std::vector<T> v;
    for(int i=0; i<4; i++) {
        v.push_back(i);
    }
    runtest_maybe_dobin<std::vector<T>, DoBinary>(name, v);
}